

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::TextFormat::
     OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
               (BaseTextGenerator *generator,
               basic_string_view<char,_std::char_traits<char>_> *values)

{
  string_view pc;
  AlphaNum *a;
  AlphaNum local_78;
  string local_48;
  string_view local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> *values_local;
  BaseTextGenerator *generator_local;
  
  pc._M_len = values->_M_len;
  pc._M_str = values->_M_str;
  local_18 = values;
  values_local = (basic_string_view<char,_std::char_traits<char>_> *)generator;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_78,pc);
  absl::lts_20240722::StrCat_abi_cxx11_(&local_48,(lts_20240722 *)&local_78,a);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  BaseTextGenerator::PrintString(generator,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}